

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  int iVar1;
  int local_34;
  int idx;
  int v;
  int base_local;
  expdesc *var_local;
  TString *n_local;
  FuncState *fs_local;
  
  if (fs == (FuncState *)0x0) {
    fs_local._4_4_ = 0;
  }
  else {
    iVar1 = searchvar(fs,n);
    if (iVar1 < 0) {
      local_34 = searchupvalue(fs,n);
      if (local_34 < 0) {
        iVar1 = singlevaraux(fs->prev,n,var,0);
        if (iVar1 == 0) {
          return 0;
        }
        local_34 = newupvalue(fs,n,var);
      }
      init_exp(var,VUPVAL,local_34);
      fs_local._4_4_ = 8;
    }
    else {
      init_exp(var,VLOCAL,iVar1);
      if (base == 0) {
        markupval(fs,iVar1);
      }
      fs_local._4_4_ = 7;
    }
  }
  return fs_local._4_4_;
}

Assistant:

static int singlevaraux (FuncState *fs, TString *n, expdesc *var, int base) {
  if (fs == NULL)  /* no more levels? */
    return VVOID;  /* default is global */
  else {
    int v = searchvar(fs, n);  /* look up locals at current level */
    if (v >= 0) {  /* found? */
      init_exp(var, VLOCAL, v);  /* variable is local */
      if (!base)
        markupval(fs, v);  /* local will be used as an upval */
      return VLOCAL;
    }
    else {  /* not found as local at current level; try upvalues */
      int idx = searchupvalue(fs, n);  /* try existing upvalues */
      if (idx < 0) {  /* not found? */
        if (singlevaraux(fs->prev, n, var, 0) == VVOID) /* try upper levels */
          return VVOID;  /* not found; is a global */
        /* else was LOCAL or UPVAL */
        idx  = newupvalue(fs, n, var);  /* will be a new upvalue */
      }
      init_exp(var, VUPVAL, idx);
      return VUPVAL;
    }
  }
}